

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedRep
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  MapKeyComparator *key_comparator;
  string *psVar11;
  long lVar12;
  long lVar13;
  undefined8 *puVar14;
  iterator iVar15;
  int index;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  Metadata MVar19;
  Metadata MVar20;
  vector<int,_std::allocator<int>_> match_list1;
  undefined1 local_c8 [80];
  size_t local_78;
  bool local_70;
  vector<int,_std::allocator<int>_> match_list2;
  LogMessageFatal local_40 [16];
  
  bVar18 = 0;
  bVar6 = repeated_field->field_0x1;
  if (0xbf < bVar6 != (bool)((bVar6 & 0x20) >> 5)) {
    CompareRepeatedRep();
LAB_00315728:
    CompareRepeatedRep((MessageDifferencer *)local_c8);
LAB_00315732:
    __assert_fail("reporter_ != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                  ,0x559,
                  "bool google::protobuf::util::MessageDifferencer::CompareRepeatedRep(const Message &, const Message &, int, const FieldDescriptor *, std::vector<SpecificField> *)"
                 );
  }
  if ((bVar6 & 0x20) == 0) goto LAB_00315728;
  MVar19 = Message::GetMetadata(message1);
  MVar20 = Message::GetMetadata(message2);
  uVar8 = Reflection::FieldSize(MVar19.reflection,message1,repeated_field);
  uVar9 = Reflection::FieldSize(MVar20.reflection,message2,repeated_field);
  bVar2 = IsTreatedAsSubset(this,repeated_field);
  if (this->reporter_ == (Reporter *)0x0 && (uVar8 != uVar9 && ((int)uVar9 <= (int)uVar8 || !bVar2))
     ) {
    return false;
  }
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  key_comparator = GetMapKeyComparator(this,repeated_field);
  bVar3 = IsTreatedAsSmartList(this,repeated_field);
  if ((key_comparator != (MapKeyComparator *)0x0) ||
     (bVar4 = IsTreatedAsSet(this,repeated_field), bVar4)) {
LAB_0031507e:
    bVar5 = MatchRepeatedFieldIndices
                      (this,message1,message2,unpacked_any,repeated_field,key_comparator,
                       parent_fields,&match_list1,&match_list2);
    bVar7 = false;
    bVar4 = false;
    if (!bVar5 && this->reporter_ == (Reporter *)0x0) goto LAB_00315685;
  }
  else {
    bVar5 = IsTreatedAsSmartSet(this,repeated_field);
    bVar4 = true;
    if (bVar5 || bVar3) goto LAB_0031507e;
  }
  local_c8._32_8_ = 2.12199579047121e-314;
  local_c8._40_8_ = 0xffffffffffffffff;
  local_c8._48_8_ = (Message *)0x0;
  local_c8._56_8_ = (Message *)0x0;
  local_c8._64_8_ = (MaybeInitializedPtr)0x0;
  local_c8._72_8_ = (UnknownFieldSet *)0x0;
  local_78 = 0xffffffffffffffff;
  local_70 = false;
  uVar10 = 0;
  bVar6 = 0;
  local_c8._0_8_ = message1;
  local_c8._8_8_ = message2;
  local_c8._16_4_ = unpacked_any;
  local_c8._24_8_ = repeated_field;
  if (!(bool)((int)uVar9 < 1 & bVar4) && 0 < (int)uVar8) {
    uVar16 = 0;
    bVar6 = 0;
    do {
      index = (int)uVar16;
      if ((bVar4) ||
         (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16] != -1)) {
        if ((bVar3) &&
           ((int)uVar10 <
            match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16])) {
          uVar17 = (ulong)uVar10;
          lVar12 = uVar17 << 0x20;
          do {
            if ((int)uVar10 < 0) {
              psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                                  (0,lVar12 >> 0x20,"0 <= j");
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_40,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                         ,0x517,*(undefined8 *)(psVar11 + 8),*(undefined8 *)psVar11);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
            }
            if (this->reporter_ == (Reporter *)0x0) goto LAB_00315683;
            local_c8._40_4_ = (int)uVar17;
            AddSpecificNewIndex((SpecificField *)local_c8,message2,repeated_field,(int)uVar17);
            iVar15._M_current =
                 (parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (parent_fields->
                super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
              ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                        ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                          *)parent_fields,iVar15,(SpecificField *)local_c8);
            }
            else {
              puVar14 = (undefined8 *)local_c8;
              for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
                (iVar15._M_current)->message1 = (Message *)*puVar14;
                puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
                iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
              }
              ppSVar1 = &(parent_fields->
                         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + 1;
            }
            (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields);
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
            match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] = -2;
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x100000000;
          } while ((int)uVar17 <
                   match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16]);
          bVar6 = 1;
        }
        AddSpecificIndex((SpecificField *)local_c8,message1,repeated_field,index);
        if (bVar4) {
          AddSpecificNewIndex((SpecificField *)local_c8,message2,repeated_field,index);
        }
        else {
          AddSpecificNewIndex((SpecificField *)local_c8,message2,repeated_field,
                              match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar16]);
          uVar10 = match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16] + 1;
        }
        bVar5 = CompareFieldValueUsingParentFields
                          (this,message1,message2,unpacked_any,repeated_field,index,local_c8._44_4_,
                           parent_fields);
        if (!bVar5) {
          if (this->reporter_ == (Reporter *)0x0) goto LAB_00315683;
          iVar15._M_current =
               (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (parent_fields->
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
            ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                      ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                        *)parent_fields,iVar15,(SpecificField *)local_c8);
          }
          else {
            puVar14 = (undefined8 *)local_c8;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              (iVar15._M_current)->message1 = (Message *)*puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          (*this->reporter_->_vptr_Reporter[4])(this->reporter_,message1,message2,parent_fields);
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          goto LAB_00315627;
        }
        if (this->reporter_ == (Reporter *)0x0) {
LAB_00315515:
          if ((this->report_matches_ != true) || (this->reporter_ == (Reporter *)0x0))
          goto LAB_00315659;
          iVar15._M_current =
               (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (parent_fields->
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
            ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                      ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                        *)parent_fields,iVar15,(SpecificField *)local_c8);
          }
          else {
            puVar14 = (undefined8 *)local_c8;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              (iVar15._M_current)->message1 = (Message *)*puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          (*this->reporter_->_vptr_Reporter[6])(this->reporter_,message1,message2,parent_fields);
        }
        else {
          if ((local_c8._40_4_ == local_c8._44_4_) ||
             (((*(uint8_t *)(local_c8._24_8_ + 2) == '\v' &&
               (bVar5 = FieldDescriptor::is_map_message_type((FieldDescriptor *)local_c8._24_8_),
               bVar5)) || (this->report_moves_ != true)))) goto LAB_00315515;
          iVar15._M_current =
               (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (parent_fields->
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
            ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                      ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                        *)parent_fields,iVar15,(SpecificField *)local_c8);
          }
          else {
            puVar14 = (undefined8 *)local_c8;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              (iVar15._M_current)->message1 = (Message *)*puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          (*this->reporter_->_vptr_Reporter[5])(this->reporter_,message1,message2,parent_fields);
        }
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
      }
      else if (bVar3) {
        if (this->reporter_ == (Reporter *)0x0) {
LAB_00315683:
          bVar7 = false;
          goto LAB_00315685;
        }
        AddSpecificIndex((SpecificField *)local_c8,message1,repeated_field,index);
        iVar15._M_current =
             (parent_fields->
             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar15._M_current ==
            (parent_fields->
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
          ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                    ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                      *)parent_fields,iVar15,(SpecificField *)local_c8);
        }
        else {
          puVar14 = (undefined8 *)local_c8;
          for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
            (iVar15._M_current)->message1 = (Message *)*puVar14;
            puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
            iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
          }
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar16] = -2;
LAB_00315627:
        bVar6 = 1;
      }
LAB_00315659:
      uVar16 = uVar16 + 1;
    } while ((uVar16 < uVar8) && (!(bool)((long)(int)uVar9 <= (long)uVar16 & bVar4)));
  }
  if (0 < (int)uVar9) {
    uVar16 = 0;
    do {
      if (bVar4) {
        if ((long)(int)uVar8 <= (long)uVar16) {
LAB_0031518d:
          bVar6 = bVar6 | !bVar2;
          if (this->reporter_ != (Reporter *)0x0) {
            local_c8._40_4_ = (int)uVar16;
            AddSpecificNewIndex((SpecificField *)local_c8,message2,repeated_field,(int)uVar16);
            iVar15._M_current =
                 (parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (parent_fields->
                super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
              ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                        ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                          *)parent_fields,iVar15,(SpecificField *)local_c8);
            }
            else {
              puVar14 = (undefined8 *)local_c8;
              for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
                (iVar15._M_current)->message1 = (Message *)*puVar14;
                puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
                iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
              }
              ppSVar1 = &(parent_fields->
                         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + 1;
            }
            (*this->reporter_->_vptr_Reporter[2])(this->reporter_,message1,message2,parent_fields);
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
          }
        }
      }
      else if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16] == -1) goto LAB_0031518d;
      uVar16 = uVar16 + 1;
    } while (uVar9 != uVar16);
  }
  if (0 < (int)uVar8) {
    uVar16 = 0;
    do {
      if (bVar4) {
        if ((long)(int)uVar9 <= (long)uVar16) {
LAB_00315246:
          if (this->reporter_ == (Reporter *)0x0) goto LAB_00315732;
          AddSpecificIndex((SpecificField *)local_c8,message1,repeated_field,(int)uVar16);
          iVar15._M_current =
               (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar15._M_current ==
              (parent_fields->
              super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
            ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                      ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                        *)parent_fields,iVar15,(SpecificField *)local_c8);
          }
          else {
            puVar14 = (undefined8 *)local_c8;
            for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
              (iVar15._M_current)->message1 = (Message *)*puVar14;
              puVar14 = puVar14 + (ulong)bVar18 * -2 + 1;
              iVar15._M_current = iVar15._M_current + (ulong)bVar18 * -0x10 + 8;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
          ppSVar1 = &(parent_fields->
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + -1;
          bVar6 = 1;
        }
      }
      else if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16] == -1) goto LAB_00315246;
      uVar16 = uVar16 + 1;
    } while (uVar8 != uVar16);
  }
  bVar7 = (bool)(bVar6 ^ 1);
LAB_00315685:
  if (match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)match_list2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)match_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool MessageDifferencer::CompareRepeatedRep(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  // the input FieldDescriptor is guaranteed to be repeated field.
  ABSL_DCHECK(repeated_field->is_repeated());
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  const int count1 = reflection1->FieldSize(message1, repeated_field);
  const int count2 = reflection2->FieldSize(message2, repeated_field);
  const bool treated_as_subset = IsTreatedAsSubset(repeated_field);

  // If the field is not treated as subset and no detailed reports is needed,
  // we do a quick check on the number of the elements to avoid unnecessary
  // comparison.
  if (count1 != count2 && reporter_ == NULL && !treated_as_subset) {
    return false;
  }
  // A match can never be found if message1 has more items than message2.
  if (count1 > count2 && reporter_ == NULL) {
    return false;
  }

  // These two list are used for store the index of the correspondent
  // element in peer repeated field.
  std::vector<int> match_list1;
  std::vector<int> match_list2;

  const MapKeyComparator* key_comparator = GetMapKeyComparator(repeated_field);
  bool smart_list = IsTreatedAsSmartList(repeated_field);
  bool simple_list = key_comparator == nullptr &&
                     !IsTreatedAsSet(repeated_field) &&
                     !IsTreatedAsSmartSet(repeated_field) && !smart_list;

  // For simple lists, we avoid matching repeated field indices, saving the
  // memory allocations that would otherwise be needed for match_list1 and
  // match_list2.
  if (!simple_list) {
    // Try to match indices of the repeated fields. Return false if match fails.
    if (!MatchRepeatedFieldIndices(
            message1, message2, unpacked_any, repeated_field, key_comparator,
            *parent_fields, &match_list1, &match_list2) &&
        reporter_ == nullptr) {
      return false;
    }
  }

  bool fieldDifferent = false;
  SpecificField specific_field;
  specific_field.message1 = &message1;
  specific_field.message2 = &message2;
  specific_field.unpacked_any = unpacked_any;
  specific_field.field = repeated_field;

  // At this point, we have already matched pairs of fields (with the reporting
  // to be done later). Now to check if the paired elements are different.
  int next_unmatched_index = 0;
  for (int i = 0; i < count1; i++) {
    if (simple_list && i >= count2) {
      break;
    }
    if (!simple_list && match_list1[i] == -1) {
      if (smart_list) {
        if (reporter_ == nullptr) return false;
        AddSpecificIndex(&specific_field, message1, repeated_field, i);
        parent_fields->push_back(specific_field);
        reporter_->ReportDeleted(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list1[i] = -2;
      }
      continue;
    }
    if (smart_list) {
      for (int j = next_unmatched_index; j < match_list1[i]; ++j) {
        ABSL_CHECK_LE(0, j);
        if (reporter_ == nullptr) return false;
        specific_field.index = j;
        AddSpecificNewIndex(&specific_field, message2, repeated_field, j);
        parent_fields->push_back(specific_field);
        reporter_->ReportAdded(message1, message2, *parent_fields);
        parent_fields->pop_back();
        fieldDifferent = true;
        // Use -2 to mark this element has been reported.
        match_list2[j] = -2;
      }
    }
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    if (simple_list) {
      AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    } else {
      AddSpecificNewIndex(&specific_field, message2, repeated_field,
                          match_list1[i]);
      next_unmatched_index = match_list1[i] + 1;
    }

    const bool result = CompareFieldValueUsingParentFields(
        message1, message2, unpacked_any, repeated_field, i,
        specific_field.new_index, parent_fields);

    // If we have found differences, either report them or terminate if
    // no reporter is present. Note that ReportModified, ReportMoved, and
    // ReportMatched are all mutually exclusive.
    if (!result) {
      if (reporter_ == NULL) return false;
      parent_fields->push_back(specific_field);
      reporter_->ReportModified(message1, message2, *parent_fields);
      parent_fields->pop_back();
      fieldDifferent = true;
    } else if (reporter_ != NULL &&
               specific_field.index != specific_field.new_index &&
               !specific_field.field->is_map() && report_moves_) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMoved(message1, message2, *parent_fields);
      parent_fields->pop_back();
    } else if (report_matches_ && reporter_ != NULL) {
      parent_fields->push_back(specific_field);
      reporter_->ReportMatched(message1, message2, *parent_fields);
      parent_fields->pop_back();
    }
  }

  // Report any remaining additions or deletions.
  for (int i = 0; i < count2; ++i) {
    if (!simple_list && match_list2[i] != -1) continue;
    if (simple_list && i < count1) continue;
    if (!treated_as_subset) {
      fieldDifferent = true;
    }

    if (reporter_ == NULL) continue;
    specific_field.index = i;
    AddSpecificNewIndex(&specific_field, message2, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportAdded(message1, message2, *parent_fields);
    parent_fields->pop_back();
  }

  for (int i = 0; i < count1; ++i) {
    if (!simple_list && match_list1[i] != -1) continue;
    if (simple_list && i < count2) continue;
    assert(reporter_ != NULL);
    AddSpecificIndex(&specific_field, message1, repeated_field, i);
    parent_fields->push_back(specific_field);
    reporter_->ReportDeleted(message1, message2, *parent_fields);
    parent_fields->pop_back();
    fieldDifferent = true;
  }
  return !fieldDifferent;
}